

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&>::
MatchAndExplain(AnyOfMatcherImpl<const_google::protobuf::FieldDescriptor_*const_&> *this,
               FieldDescriptor **x,MatchResultListener *listener)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  string result;
  string no_match_result;
  StringMatchResultListener slistener;
  long *local_218;
  long local_210;
  long local_208 [2];
  char *local_1f8;
  long local_1f0;
  char local_1e8;
  undefined7 uStack_1e7;
  MatchResultListener *local_1d8;
  FieldDescriptor **local_1d0;
  MatchResultListener local_1c8;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1f8 = &local_1e8;
  local_1f0 = 0;
  local_1e8 = '\0';
  bVar4 = (this->matchers_).
          super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_1d8 = listener;
  local_1d0 = x;
  if (bVar4) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      local_1c8.stream_ = local_1a8;
      local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
      std::__cxx11::stringstream::stringstream(local_1b8);
      bVar1 = MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>::MatchAndExplain
                        ((MatcherBase<const_google::protobuf::FieldDescriptor_*const_&> *)
                         ((long)&(((this->matchers_).
                                   super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super_MatcherBase<const_google::protobuf::FieldDescriptor_*const_&>
                                 ).super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                         lVar2),local_1d0,&local_1c8);
      if (bVar1) {
        std::__cxx11::stringbuf::str();
        if (local_1d8->stream_ != (ostream *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1d8->stream_,(char *)local_218,local_210);
        }
      }
      else if (local_1f0 == 0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)&local_1f8,(string *)&local_218);
      }
      else {
        std::__cxx11::stringbuf::str();
        if (local_210 != 0) {
          std::__cxx11::string::append((char *)&local_1f8);
          std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_218);
        }
      }
      if (local_218 != local_208) {
        operator_delete(local_218,local_208[0] + 1);
      }
      local_1c8._vptr_MatchResultListener = (_func_int **)&PTR__StringMatchResultListener_018ce748;
      std::__cxx11::stringstream::~stringstream(local_1b8);
      std::ios_base::~ios_base(local_138);
      if (bVar1) goto LAB_0061a2d9;
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x18;
      bVar4 = uVar3 < (ulong)(((long)(this->matchers_).
                                     super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->matchers_).
                                     super__Vector_base<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>,_std::allocator<testing::Matcher<const_google::protobuf::FieldDescriptor_*const_&>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555);
    } while (bVar4);
  }
  if (local_1d8->stream_ != (ostream *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1d8->stream_,local_1f8,local_1f0);
  }
LAB_0061a2d9:
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  return bVar4;
}

Assistant:

bool MatchAndExplain(const T& x,
                       MatchResultListener* listener) const override {
    std::string no_match_result;

    // If either matcher1_ or matcher2_ matches x, we just need to
    // explain why *one* of them matches.
    for (size_t i = 0; i < matchers_.size(); ++i) {
      StringMatchResultListener slistener;
      if (matchers_[i].MatchAndExplain(x, &slistener)) {
        *listener << slistener.str();
        return true;
      } else {
        if (no_match_result.empty()) {
          no_match_result = slistener.str();
        } else {
          std::string result = slistener.str();
          if (!result.empty()) {
            no_match_result += ", and ";
            no_match_result += result;
          }
        }
      }
    }

    // Otherwise we need to explain why *both* of them fail.
    *listener << no_match_result;
    return false;
  }